

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colTrie.c
# Opt level: O3

int Col_TrieMapUnset(Col_Word map,Col_Word key)

{
  Col_Word CVar1;
  uint uVar2;
  Col_Word CVar3;
  Col_Word parent;
  Col_Word local_28;
  byte *local_20;
  
  if (map == 0) {
LAB_00114335:
    *(long *)(map + 0x10) = *(long *)(map + 0x10) + -1;
    goto LAB_00114339;
  }
  if ((map & 0xf) == 0) {
    if ((*(byte *)map & 2) != 0) {
      uVar2 = *(byte *)map & 0xfffffffe;
      goto LAB_00114304;
    }
LAB_00114350:
    CVar1 = TrieMapFindNode(map,key,0,(int *)0x0,(Col_Word *)&local_20,&local_28,(Col_Word *)0x0,
                            (Col_Word *)0x0,(size_t *)0x0,(size_t *)0x0);
  }
  else {
    uVar2 = immediateWordTypes[(uint)map & 0x1f];
LAB_00114304:
    if (uVar2 == 0xffffffff) goto LAB_00114350;
    if (uVar2 != 0x42) goto LAB_00114335;
    CVar1 = StringTrieMapFindNode
                      (map,key,0,(int *)0x0,(Col_Word *)&local_20,&local_28,(Col_Word *)0x0,
                       (Col_Word *)0x0,(size_t *)0x0,(Col_Char *)0x0);
  }
  if (CVar1 == 0) {
    return 0;
  }
  *(long *)(map + 0x10) = *(long *)(map + 0x10) + -1;
  if (local_20 == (byte *)0x0) {
LAB_00114339:
    *(undefined8 *)(map + 0x18) = 0;
    return 1;
  }
  CVar3 = *(Col_Word *)(local_28 + 0x18);
  if (CVar1 == CVar3) {
    CVar3 = *(Col_Word *)(local_28 + 0x10);
  }
  if (local_20 == (byte *)map) {
    *(Col_Word *)(map + 0x18) = CVar3;
    return 1;
  }
  if (((ulong)local_20 & 0xf) == 0) {
    if ((*local_20 & 2) != 0) {
      uVar2 = *local_20 & 0xfffffffe;
      goto LAB_001143cc;
    }
  }
  else {
    uVar2 = immediateWordTypes[(uint)local_20 & 0x1f];
LAB_001143cc:
    if (uVar2 == 0x56) goto LAB_001143e4;
  }
  local_20 = (byte *)ConvertStringNodeToMutable((Col_Word)local_20,map,key);
LAB_001143e4:
  if (*(Col_Word *)(local_20 + 0x10) == local_28) {
    *(Col_Word *)(local_20 + 0x10) = CVar3;
    return 1;
  }
  *(Col_Word *)(local_20 + 0x18) = CVar3;
  return 1;
}

Assistant:

int
Col_TrieMapUnset(
    Col_Word map,   /*!< Trie map to remove entry from. */
    Col_Word key)   /*!< Entry key. Can be any word type, including string,
                         however it must match the actual type used by the
                         map. */
{
    Col_Word node, grandParent, parent, sibling;

    /*
     * Check preconditions.
     */

    /*! @typecheck{COL_ERROR_WORDTRIEMAP,map} */
    TYPECHECK_WORDTRIEMAP(map) return 0;

    switch (WORD_TYPE(map)) {
    case WORD_TYPE_STRTRIEMAP:
        node = StringTrieMapFindNode(map, key, 0, NULL, &grandParent, &parent,
                NULL, NULL, NULL, NULL);
        break;

    case WORD_TYPE_CUSTOM:
        node = TrieMapFindNode(map, key, 0, NULL, &grandParent, &parent, NULL,
                NULL, NULL, NULL);
        break;

    /* WORD_TYPE_UNKNOWN */

    default:
        /* CANTHAPPEN */
        ASSERT(0);
    }

    if (!node) {
        /*
         * Not found.
         */

        return 0;
    }

    WORD_TRIEMAP_SIZE(map)--;

    if (!grandParent) {
        /*
         * Last entry.
         */

        ASSERT(parent == map);
        ASSERT(WORD_TRIEMAP_ROOT(map) == node);
        ASSERT(WORD_TRIEMAP_SIZE(map) == 0);
        WORD_TRIEMAP_ROOT(map) = WORD_NIL;

        return 1;
    }

    /*
     * Replace parent by sibling.
     */

    ASSERT(WORD_TYPE(parent) == WORD_TYPE_STRTRIENODE || WORD_TYPE(parent) == WORD_TYPE_MSTRTRIENODE);
    if (node == WORD_TRIENODE_RIGHT(parent)) {
        sibling = WORD_TRIENODE_LEFT(parent);
    } else {
        sibling = WORD_TRIENODE_RIGHT(parent);
    }
    if (grandParent == map) {
        /*
         * Parent was root.
         */

        ASSERT(WORD_TRIEMAP_ROOT(map) == parent);
        WORD_TRIEMAP_ROOT(map) = sibling;
    } else {
        if (WORD_TYPE(grandParent) != WORD_TYPE_MSTRTRIENODE) {
            /*
             * Grandparent is immutable, convert first.
             */

            ASSERT(WORD_TYPE(grandParent) == WORD_TYPE_STRTRIENODE);
            grandParent = ConvertStringNodeToMutable(grandParent, map, key);
        }
        ASSERT(WORD_TYPE(grandParent) == WORD_TYPE_MSTRTRIENODE);
        if (WORD_TRIENODE_LEFT(grandParent) == parent) {
            WORD_TRIENODE_LEFT(grandParent) = sibling;
        } else {
            WORD_TRIENODE_RIGHT(grandParent) = sibling;
        }
    }

    return 1;
}